

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

Stream * __thiscall
kratos::Stream::operator<<
          (Stream *this,
          pair<kratos::Port_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *port)

{
  undefined1 *puVar1;
  ostream *poVar2;
  Port *port_00;
  string_view sVar3;
  string local_50;
  char local_29;
  
  if ((port->first->super_Var).super_IRNode.comment._M_string_length != 0) {
    sVar3 = SystemVerilogCodeGen::indent
                      (*(SystemVerilogCodeGen **)&(this->super_stringstream).field_0x88);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&(this->super_stringstream).field_0x10,sVar3._M_str,sVar3._M_len)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"// ",3);
    strip_newline(&local_50,&(port->first->super_Var).super_IRNode.comment);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
    puVar1 = &(this->super_stringstream).field_0x90;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    local_29 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_29,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(char *)(*(long *)&(this->super_stringstream).field_0x80 + 0xbc) == '\x01') {
    (port->first->super_Var).super_IRNode.verilog_ln =
         *(uint32_t *)&(this->super_stringstream).field_0x90;
  }
  sVar3 = SystemVerilogCodeGen::indent
                    (*(SystemVerilogCodeGen **)&(this->super_stringstream).field_0x88);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&(this->super_stringstream).field_0x10,sVar3._M_str,sVar3._M_len);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(port->first->super_Var).before_var_str_._M_dataplus._M_p,
                      (port->first->super_Var).before_var_str_._M_string_length);
  SystemVerilogCodeGen::get_port_str_abi_cxx11_
            (&local_50,(SystemVerilogCodeGen *)port->first,port_00);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(port->first->super_Var).after_var_str_._M_dataplus._M_p,
                      (port->first->super_Var).after_var_str_._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(port->second)._M_dataplus._M_p,(port->second)._M_string_length);
  puVar1 = &(this->super_stringstream).field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  local_29 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_29,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

Stream& Stream::operator<<(const std::pair<Port*, std::string>& port) {
    const auto& [p, end] = port;
    if (!p->comment.empty())
        (*this) << codegen_->indent() << "// " << strip_newline(p->comment) << endl();
    if (generator_->debug) {
        p->verilog_ln = line_no_;
    }

    (*this) << codegen_->indent() << p->before_var_str() << SystemVerilogCodeGen::get_port_str(p)
            << p->after_var_str() << end << endl();

    return *this;
}